

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::setQueryString(XMLUri *this,XMLCh *newQueryString)

{
  bool bVar1;
  XMLCh *pXVar2;
  MalformedURLException *this_00;
  
  if (newQueryString == (XMLCh *)0x0) {
    if (this->fQueryString != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    this->fQueryString = (XMLCh *)0x0;
    return;
  }
  if (this->fHost == (XMLCh *)0x0) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x54c,XMLNUM_URI_Component_for_GenURI_Only,(XMLCh *)errMsg_QUERY,newQueryString,
               (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
  }
  else if (this->fPath == (XMLCh *)0x0) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x554,XMLNUM_URI_NullPath,(XMLCh *)errMsg_QUERY,newQueryString,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
  }
  else {
    bVar1 = isURIString(newQueryString);
    if (bVar1) {
      if (this->fQueryString != (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])();
      }
      pXVar2 = XMLString::replicate(newQueryString,this->fMemoryManager);
      this->fQueryString = pXVar2;
      return;
    }
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x55c,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_QUERY,newQueryString,
               (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
  }
  __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLUri::setQueryString(const XMLCh* const newQueryString)
{
	if ( !newQueryString )
    {
        if (getQueryString())
            fMemoryManager->deallocate(fQueryString);//delete [] fQueryString;

        fQueryString = 0;
	}
	else if (!isGenericURI())
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_for_GenURI_Only
                , errMsg_QUERY
                , newQueryString
                , fMemoryManager);
	}
	else if ( !getPath() )
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_NullPath
                , errMsg_QUERY
                , newQueryString
                , fMemoryManager);
	}
	else if (!isURIString(newQueryString))
    {
        ThrowXMLwithMemMgr2(MalformedURLException
               , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
               , errMsg_QUERY
               , newQueryString
               , fMemoryManager);
	}
	else
    {
        if (getQueryString())
        {
            fMemoryManager->deallocate(fQueryString);//delete [] fQueryString;
        }

        fQueryString = XMLString::replicate(newQueryString, fMemoryManager);
	}
}